

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O0

double * __thiscall fizplex::SVector::operator[](SVector *this,size_t ind)

{
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *pvVar1;
  reference pvVar2;
  size_t in_RSI;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *in_RDI;
  size_t i;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *this_00;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *this_01;
  double *local_8;
  
  this_00 = (vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)0x0;
  do {
    this_01 = this_00;
    pvVar1 = (vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
             std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
             size(in_RDI);
    if (pvVar1 <= this_00) {
      add_value((SVector *)this_01,(size_t)in_RDI,(double)this_00);
      pvVar2 = std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
               back(this_00);
LAB_0013826c:
      local_8 = &pvVar2->value;
      return local_8;
    }
    pvVar2 = std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
             operator[](in_RDI,(size_type)this_01);
    if (pvVar2->index == in_RSI) {
      pvVar2 = std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
               operator[](in_RDI,(size_type)this_01);
      goto LAB_0013826c;
    }
    this_00 = (vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
              ((long)&(this_01->
                      super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

double &SVector::operator[](size_t ind) {
  for (size_t i = 0; i < values.size(); ++i) {
    if (values[i].index == ind)
      return values[i].value;
  }
  add_value(ind, 0.0);
  return values.back().value;
}